

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsSetArrayBufferExtraInfo(JsValueRef arrayBuffer,char extraInfo)

{
  bool bVar1;
  ArrayBuffer *this;
  DebugCheckNoException local_24;
  DebugCheckNoException __debugCheckNoException;
  char extraInfo_local;
  JsValueRef arrayBuffer_local;
  
  if (arrayBuffer == (JsValueRef)0x0) {
    arrayBuffer_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    __debugCheckNoException.__exceptionCheck.handledExceptionType._3_1_ = extraInfo;
    unique0x1000008c = arrayBuffer;
    DebugCheckNoException::DebugCheckNoException(&local_24);
    bVar1 = Js::VarIs<Js::ArrayBuffer>(stack0xffffffffffffffe8);
    if (bVar1) {
      this = Js::VarTo<Js::ArrayBuffer>(stack0xffffffffffffffe8);
      Js::ArrayBufferBase::SetExtraInfoBits
                (&this->super_ArrayBufferBase,
                 __debugCheckNoException.__exceptionCheck.handledExceptionType._3_1_);
    }
    else {
      arrayBuffer_local._4_4_ = JsErrorInvalidArgument;
    }
    local_24.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_24);
    if (bVar1) {
      arrayBuffer_local._4_4_ = JsNoError;
    }
  }
  return arrayBuffer_local._4_4_;
}

Assistant:

END_JSRT_NO_EXCEPTION

}

CHAKRA_API
JsSetArrayBufferExtraInfo(
    _In_ JsValueRef arrayBuffer,
    _In_ char extraInfo)
{
    VALIDATE_JSREF(arrayBuffer);
    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!Js::VarIs<Js::ArrayBuffer>(arrayBuffer))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        Js::VarTo<Js::ArrayBuffer>(arrayBuffer)->SetExtraInfoBits(extraInfo);
    }